

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

void swrenderer::R_DeinitPlanes(void)

{
  undefined8 *puVar1;
  int i;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  fakeActive = 0;
  puVar3 = (undefined8 *)freehead;
  for (lVar2 = 0; puVar4 = freetail, lVar2 != 0x81; lVar2 = lVar2 + 1) {
    *puVar3 = (&visplanes)[lVar2];
    (&visplanes)[lVar2] = 0;
    puVar4 = puVar3;
    puVar1 = (undefined8 *)freehead;
    do {
      freehead = (undefined *)puVar1;
      puVar3 = puVar4;
      puVar4 = (undefined8 *)*puVar3;
      puVar1 = puVar4;
    } while (puVar4 != (undefined8 *)0x0);
  }
  while (puVar4 != (undefined8 *)0x0) {
    puVar3 = (undefined8 *)*puVar4;
    free(puVar4);
    puVar4 = puVar3;
  }
  return;
}

Assistant:

void R_DeinitPlanes ()
{
	fakeActive = 0;

	// do not use R_ClearPlanes because at this point the screen pointer is no longer valid.
	for (int i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
	{
		for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
		{
			freehead = &(*freehead)->next;
		}
	}
	for (visplane_t *pl = freetail; pl != NULL; )
	{
		visplane_t *next = pl->next;
		free (pl);
		pl = next;
	}
}